

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O2

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_limits(LicenseVerifier *this,FullLicenseInfo *lic_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar1;
  EventRegistry *pEVar2;
  char *licenseLocationId;
  bool bVar3;
  LCC_EVENT_TYPE event;
  time_t tVar4;
  const_iterator cVar5;
  time_t tVar6;
  FUNCTION_RETURN FVar7;
  allocator local_59;
  key_type local_58;
  char *local_38;
  
  uVar1 = lic_info->m_magic;
  if (uVar1 != 0) {
    EventRegistry::addEvent
              (this->m_event_registry,IFF_LOOPBACK,(lic_info->source)._M_dataplus._M_p,(char *)0x0);
  }
  tVar4 = time((time_t *)0x0);
  std::__cxx11::string::string((string *)&local_58,"valid-to",&local_59);
  this_00 = &lic_info->m_limits;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (uVar1 == 0) {
    bVar3 = true;
    if ((_Rb_tree_header *)cVar5._M_node != &(lic_info->m_limits)._M_t._M_impl.super__Rb_tree_header
       ) {
      tVar6 = seconds_from_epoch((string *)(cVar5._M_node + 2));
      if (tVar6 < tVar4) {
        pEVar2 = this->m_event_registry;
        local_38 = (lic_info->source)._M_dataplus._M_p;
        std::operator+(&local_58,"Expired ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (cVar5._M_node + 2));
        EventRegistry::addEvent(pEVar2,PRODUCT_EXPIRED,local_38,local_58._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_58);
        goto LAB_0016fead;
      }
    }
  }
  else {
LAB_0016fead:
    bVar3 = false;
  }
  std::__cxx11::string::string((string *)&local_58,"valid-from",&local_59);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar3) {
    bVar3 = true;
    if ((_Rb_tree_header *)cVar5._M_node == &(lic_info->m_limits)._M_t._M_impl.super__Rb_tree_header
       ) goto LAB_0016ff3f;
    tVar6 = seconds_from_epoch((string *)(cVar5._M_node + 2));
    if (tVar6 <= tVar4) goto LAB_0016ff3f;
    pEVar2 = this->m_event_registry;
    licenseLocationId = (lic_info->source)._M_dataplus._M_p;
    std::operator+(&local_58,"Valid from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (cVar5._M_node + 2));
    EventRegistry::addEvent(pEVar2,PRODUCT_EXPIRED,licenseLocationId,local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar3 = false;
LAB_0016ff3f:
  std::__cxx11::string::string((string *)&local_58,"client-signature",&local_59);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar3) {
    if ((_Rb_tree_header *)cVar5._M_node == &(lic_info->m_limits)._M_t._M_impl.super__Rb_tree_header
       ) {
      FVar7 = FUNC_RET_OK;
    }
    else {
      event = hw_identifier::HwIdentifierFacade::validate_pc_signature
                        ((string *)(cVar5._M_node + 2));
      EventRegistry::addEvent(this->m_event_registry,event,&lic_info->source);
      FVar7 = (uint)(event != LICENSE_OK) * 2;
    }
  }
  else {
    FVar7 = FUNC_RET_ERROR;
  }
  return FVar7;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_limits(const FullLicenseInfo& lic_info) {
	bool is_valid = LCC_VERIFY_MAGIC;
	if (!is_valid) {
		m_event_registry.addEvent(LICENSE_CORRUPTED, lic_info.source.c_str());
	}
	const time_t now = time(nullptr);
	auto expiry = lic_info.m_limits.find(PARAM_EXPIRY_DATE);
	if (is_valid && expiry != lic_info.m_limits.end()) {
		if (seconds_from_epoch(expiry->second) < now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(), ("Expired " + expiry->second).c_str());
			is_valid = false;
		}
	}
	const auto start_date = lic_info.m_limits.find(PARAM_BEGIN_DATE);
	if (is_valid && start_date != lic_info.m_limits.end()) {
		if (seconds_from_epoch(start_date->second) > now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(),
									  ("Valid from " + start_date->second).c_str());
			is_valid = false;
		}
	}
	const auto client_sig = lic_info.m_limits.find(PARAM_CLIENT_SIGNATURE);
	if (is_valid && client_sig != lic_info.m_limits.end()) {
		const LCC_EVENT_TYPE event = hw_identifier::HwIdentifierFacade::validate_pc_signature(client_sig->second);
		m_event_registry.addEvent(event, lic_info.source);
		is_valid = is_valid && (event == LICENSE_OK);
	}
	return is_valid ? FUNC_RET_OK : FUNC_RET_ERROR;
}